

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::TypeResolver::visit(TypeResolver *this,TypeMetaFunction *c)

{
  size_t *psVar1;
  Allocator *pAVar2;
  bool bVar3;
  int iVar4;
  ExpressionKind EVar5;
  ConcreteType *pCVar6;
  Constant *pCVar7;
  CommaSeparatedList *args_1;
  Identifier i;
  QualifiedIdentifier *args;
  Context *args_00;
  string_view newString;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_b8;
  CompileMessage local_60;
  
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&c->source);
  EVar5 = (c->super_Expression).kind;
  if (EVar5 == type) {
    iVar4 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c);
    if ((char)iVar4 != '\0') {
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[5])(&local_b8,c);
      pCVar6 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type>
                         (&pAVar2->pool,
                          &(c->super_Expression).super_Statement.super_ASTObject.context,
                          (Type *)&local_b8);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)&local_b8.numAllocated);
      return &pCVar6->super_Expression;
    }
    EVar5 = (c->super_Expression).kind;
  }
  if ((EVar5 == value) &&
     (iVar4 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c),
     (char)iVar4 != '\0')) {
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    AST::TypeMetaFunction::getResultValue((Value *)&local_b8,c);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar2->pool,&(c->super_Expression).super_Statement.super_ASTObject.context
                        ,(Value *)&local_b8);
    soul::Value::~Value((Value *)&local_b8);
    return &pCVar7->super_Expression;
  }
  bVar3 = AST::TypeMetaFunction::isSizeOfUnsizedType(c);
  if (bVar3) {
    args_00 = &(c->super_Expression).super_Statement.super_ASTObject.context;
    args_1 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,args_00);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&args_1->items,&c->source);
    newString._M_str = "get_array_size";
    newString._M_len = 0xe;
    i = Identifier::Pool::get
                  (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->identifiers,
                   newString);
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    IdentifierPath::IdentifierPath((IdentifierPath *)&local_b8,i);
    args = PoolAllocator::
           allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                     (&pAVar2->pool,args_00,(IdentifierPath *)&local_b8);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_b8);
    local_b8.items._0_1_ = 1;
    c = (TypeMetaFunction *)
        PoolAllocator::
        allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                  (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,args,args_1,
                   (bool *)&local_b8);
  }
  else {
    if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors != true) {
      AST::TypeMetaFunction::throwErrorIfUnresolved(c);
      Errors::cannotResolveSourceType<>();
      AST::Context::throwError
                (&(c->super_Expression).super_Statement.super_ASTObject.context,&local_60,false);
    }
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  return (Expression *)(CallOrCast *)c;
}

Assistant:

AST::Expression& visit (AST::TypeMetaFunction& c) override
        {
            super::visit (c);

            if (AST::isResolvedAsType (c))
                return allocator.allocate<AST::ConcreteType> (c.context, c.resolveAsType());

            if (AST::isResolvedAsValue (c))
                return allocator.allocate<AST::Constant> (c.context, c.getResultValue());

            if (c.isSizeOfUnsizedType())
            {
                auto& argList = allocator.allocate<AST::CommaSeparatedList> (c.context);
                argList.items.push_back (c.source);

                auto name = allocator.identifiers.get ("get_array_size");
                auto& qi = allocator.allocate<AST::QualifiedIdentifier> (c.context, IdentifierPath (name));
                return allocator.allocate<AST::CallOrCast> (qi, argList, true);
            }

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                c.throwErrorIfUnresolved();
                c.context.throwError (Errors::cannotResolveSourceType());
            }

            return c;
        }